

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_transaction.cpp
# Opt level: O1

TransactionContext * __thiscall
cfd::TransactionContext::GetTxOutAddress(TransactionContext *this,uint32_t index,NetType net_type)

{
  CfdException *this_00;
  NetType in_ECX;
  undefined4 in_register_00000034;
  ulong uVar1;
  AddressFactory address_factory;
  Script local_80;
  AddressFactory local_48;
  
  uVar1 = (*(long *)(CONCAT44(in_register_00000034,index) + 0x30) -
           *(long *)(CONCAT44(in_register_00000034,index) + 0x28) >> 4) * -0x3333333333333333;
  if (net_type <= uVar1 && uVar1 - net_type != 0) {
    AddressFactory::AddressFactory(&local_48,in_ECX);
    cfd::core::AbstractTxOut::GetLockingScript();
    AddressFactory::GetAddressByLockingScript((AddressFactory *)this,(Script *)&local_48);
    core::Script::~Script(&local_80);
    local_48._vptr_AddressFactory = (_func_int **)&PTR__AddressFactory_002b3130;
    std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::
    ~vector(&local_48.prefix_list_);
    return this;
  }
  this_00 = (CfdException *)__cxa_allocate_exception(0x30);
  local_80._vptr_Script =
       (_func_int **)
       ((long)&local_80.script_data_.data_.
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data + 8);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"vout out_of_range error.","")
  ;
  core::CfdException::CfdException(this_00,kCfdOutOfRangeError,(string *)&local_80);
  __cxa_throw(this_00,&core::CfdException::typeinfo,core::CfdException::~CfdException);
}

Assistant:

Address TransactionContext::GetTxOutAddress(
    uint32_t index, NetType net_type) const {
  if (vout_.size() <= index) {
    throw CfdException(
        CfdError::kCfdOutOfRangeError, "vout out_of_range error.");
  }
  AddressFactory address_factory(net_type);
  return address_factory.GetAddressByLockingScript(
      vout_[index].GetLockingScript());
}